

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<unsigned_int> * __thiscall
wasm::WATParser::ParseDefsCtx::getLocalFromName
          (Result<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *this,Name name)

{
  bool bVar1;
  Index IVar2;
  string *this_00;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  local_58 = name.super_IString.str._M_len;
  if (this->func == (Function *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"cannot access locals outside of a function",
               (allocator<char> *)&local_78);
    Lexer::err((Err *)&name_local.super_IString.str._M_str,&this->in,&local_b8);
    std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,
               &name_local.super_IString.str._M_str);
    std::__cxx11::string::~string((string *)&name_local.super_IString.str._M_str);
    this_00 = &local_b8;
  }
  else {
    bVar1 = Function::hasLocalIndex(this->func,name);
    if (bVar1) {
      IVar2 = Function::getLocalIndex(this->func,name);
      *(Index *)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::Err> = IVar2;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<unsigned_int,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::Err> + 0x20) = '\0';
      return __return_storage_ptr__;
    }
    IString::toString_abi_cxx11_(&local_d8,(IString *)local_58);
    std::operator+(&local_78,"local $",&local_d8);
    std::operator+(&local_98,&local_78," does not exist");
    Lexer::err((Err *)&name_local.super_IString.str._M_str,&this->in,&local_98);
    std::__detail::__variant::_Variant_storage<false,unsigned_int,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,unsigned_int,wasm::Err> *)__return_storage_ptr__,
               &name_local.super_IString.str._M_str);
    std::__cxx11::string::~string((string *)&name_local.super_IString.str._M_str);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = &local_d8;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Result<Index> getLocalFromName(Name name) {
    if (!func) {
      return in.err("cannot access locals outside of a function");
    }
    if (!func->hasLocalIndex(name)) {
      return in.err("local $" + name.toString() + " does not exist");
    }
    return func->getLocalIndex(name);
  }